

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O1

int ps_alignment_populate(ps_alignment_t *al)

{
  ps_alignment_vector_t *vec;
  ushort uVar1;
  short sVar2;
  short sVar3;
  uint16 uVar4;
  int wid;
  int iVar5;
  dict2pid_t *d2p;
  bin_mdef_t *pbVar6;
  dict_t *pdVar7;
  bool bVar8;
  s3ssid_t sVar9;
  ps_alignment_entry_t *ppVar10;
  int iVar11;
  s3ssid_t **ppsVar12;
  int32 iVar13;
  long lVar14;
  ulong uVar15;
  ps_alignment_entry_t *ppVar16;
  int iVar17;
  ulong uVar18;
  int local_70;
  
  vec = &al->sseq;
  (al->sseq).n_ent = 0;
  (al->state).n_ent = 0;
  d2p = al->d2p;
  pbVar6 = d2p->mdef;
  uVar1 = (al->word).n_ent;
  uVar15 = (ulong)uVar1;
  if (uVar1 != 0) {
    local_70 = pbVar6->sil;
    pdVar7 = d2p->dict;
    uVar18 = 0;
    do {
      ppVar10 = (al->word).seq;
      ppVar16 = ppVar10 + uVar18;
      if ((long)uVar18 < (long)(uVar15 - 1)) {
        iVar13 = (int32)*pdVar7->word[ppVar16[1].id.wid].ciphone;
      }
      else {
        iVar13 = pbVar6->sil;
      }
      wid = ppVar10[uVar18].id.wid;
      iVar5 = pdVar7->word[wid].pronlen;
      ppVar10 = ps_alignment_vector_grow_one(vec);
      if (ppVar10 == (ps_alignment_entry_t *)0x0) {
        bVar8 = false;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                ,0xa1,"Failed to add phone entry!\n");
      }
      else {
        sVar2 = *pdVar7->word[wid].ciphone;
        (ppVar10->id).pid.cipid = sVar2;
        (ppVar10->id).pid.tmatid = pbVar6->phone[sVar2].tmat;
        ppVar10->start = ppVar16->start;
        ppVar10->duration = ppVar16->duration;
        ppVar10->score = 0;
        iVar17 = (int)uVar18;
        ppVar10->parent = iVar17;
        ppVar16->child = ((uint)((int)ppVar10 - *(int *)&vec->seq) >> 2) * -0x49249249 & 0xffff;
        sVar2 = (ppVar10->id).pid.cipid;
        if (iVar5 == 1) {
          ppsVar12 = d2p->lrdiph_rc[sVar2] + local_70;
          iVar11 = iVar13;
        }
        else {
          ppsVar12 = d2p->ldiph_lc[sVar2] + pdVar7->word[wid].ciphone[1];
          iVar11 = local_70;
        }
        sVar9 = (*ppsVar12)[iVar11];
        (ppVar10->id).pid.ssid = sVar9;
        if (sVar9 == 0xffff) {
          __assert_fail("sent->id.pid.ssid != BAD_SSID",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                        ,0xb2,"int ps_alignment_populate(ps_alignment_t *)");
        }
        uVar15 = 1;
        if (2 < iVar5) {
          uVar15 = 1;
          do {
            ppVar10 = ps_alignment_vector_grow_one(vec);
            if (ppVar10 == (ps_alignment_entry_t *)0x0) {
              bVar8 = false;
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0xb7,"Failed to add phone entry!\n");
              goto LAB_0010eca5;
            }
            sVar2 = pdVar7->word[wid].ciphone[uVar15];
            (ppVar10->id).pid.cipid = sVar2;
            (ppVar10->id).pid.tmatid = pbVar6->phone[sVar2].tmat;
            sVar9 = dict2pid_internal(d2p,wid,(int)uVar15);
            (ppVar10->id).pid.ssid = sVar9;
            if (sVar9 == 0xffff) {
              __assert_fail("sent->id.pid.ssid != BAD_SSID",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                            ,0xbd,"int ps_alignment_populate(ps_alignment_t *)");
            }
            ppVar10->start = ppVar16->start;
            ppVar10->duration = ppVar16->duration;
            ppVar10->score = 0;
            ppVar10->parent = iVar17;
            uVar15 = uVar15 + 1;
          } while (iVar5 - 1U != uVar15);
        }
        if ((int)(uint)uVar15 < iVar5) {
          if ((uint)uVar15 != iVar5 - 1U) {
            __assert_fail("j == len - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,199,"int ps_alignment_populate(ps_alignment_t *)");
          }
          ppVar10 = ps_alignment_vector_grow_one(vec);
          if (ppVar10 == (ps_alignment_entry_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                    ,0xc9,"Failed to add phone entry!\n");
          }
          else {
            sVar2 = pdVar7->word[wid].ciphone[(long)pdVar7->word[wid].pronlen + -1];
            (ppVar10->id).pid.cipid = sVar2;
            (ppVar10->id).pid.tmatid = pbVar6->phone[sVar2].tmat;
            sVar3 = pdVar7->word[wid].ciphone[(long)pdVar7->word[wid].pronlen + -2];
            sVar9 = d2p->rssid[sVar2][sVar3].ssid[d2p->rssid[sVar2][sVar3].cimap[iVar13]];
            (ppVar10->id).pid.ssid = sVar9;
            if (sVar9 == 0xffff) {
              __assert_fail("sent->id.pid.ssid != BAD_SSID",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                            ,0xd1,"int ps_alignment_populate(ps_alignment_t *)");
            }
            ppVar10->start = ppVar16->start;
            ppVar10->duration = ppVar16->duration;
            ppVar10->score = 0;
            ppVar10->parent = iVar17;
          }
          if (ppVar10 == (ps_alignment_entry_t *)0x0) {
            bVar8 = false;
            goto LAB_0010eca5;
          }
        }
        local_70 = (int)pdVar7->word[wid].ciphone[(long)pdVar7->word[wid].pronlen + -1];
        bVar8 = true;
      }
LAB_0010eca5:
      if (!bVar8) {
        return -1;
      }
      uVar18 = uVar18 + 1;
      uVar15 = (ulong)(al->word).n_ent;
    } while (uVar18 < uVar15);
  }
  if ((al->sseq).n_ent != 0) {
    uVar15 = 0;
    do {
      if (0 < pbVar6->n_emit_state) {
        ppVar16 = vec->seq + uVar15;
        lVar14 = 0;
        do {
          ppVar10 = ps_alignment_vector_grow_one(&al->state);
          if (ppVar10 == (ps_alignment_entry_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                    ,0xe6,"Failed to add state entry!\n");
            return -1;
          }
          uVar4 = pbVar6->sseq[(ppVar16->id).pid.ssid][lVar14];
          (ppVar10->id).pid.cipid = uVar4;
          if (uVar4 == 0xffff) {
            __assert_fail("sent->id.senid != BAD_SENID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0xea,"int ps_alignment_populate(ps_alignment_t *)");
          }
          ppVar10->start = ppVar16->start;
          ppVar10->duration = ppVar16->duration;
          ppVar10->score = 0;
          ppVar10->parent = (int)uVar15;
          if (lVar14 == 0) {
            ppVar16->child =
                 ((uint)((int)ppVar10 - *(int *)&(al->state).seq) >> 2) * -0x49249249 & 0xffff;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pbVar6->n_emit_state);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (al->sseq).n_ent);
  }
  return 0;
}

Assistant:

int
ps_alignment_populate(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i, lc;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    lc = bin_mdef_silphone(mdef);
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j, rc;

        if (i < al->word.n_ent - 1)
            rc = dict_first_phone(dict, al->word.seq[i+1].id.wid);
        else
            rc = bin_mdef_silphone(mdef);

        /* First phone. */
        if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
            E_ERROR("Failed to add phone entry!\n");
            return -1;
        }
        sent->id.pid.cipid = dict_first_phone(dict, wid);
        sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
        sent->start = went->start;
        sent->duration = went->duration;
        sent->score = 0;
        sent->parent = i;
        went->child = (uint16)(sent - al->sseq.seq);
        if (len == 1)
            sent->id.pid.ssid
                = dict2pid_lrdiph_rc(d2p, sent->id.pid.cipid, lc, rc);
        else
            sent->id.pid.ssid
                = dict2pid_ldiph_lc(d2p, sent->id.pid.cipid,
                                    dict_second_phone(dict, wid), lc);
        assert(sent->id.pid.ssid != BAD_SSID);

        /* Internal phones. */
        for (j = 1; j < len - 1; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = dict2pid_internal(d2p, wid, j);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }

        /* Last phone. */
        if (j < len) {
            xwdssid_t *rssid;
            assert(j == len - 1);
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_last_phone(dict, wid);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            rssid = dict2pid_rssid(d2p, sent->id.pid.cipid,
                                   dict_second_last_phone(dict, wid));
            sent->id.pid.ssid = rssid->ssid[rssid->cimap[rc]];
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
        /* Update lc.  Could just use sent->id.pid.cipid here but that
         * seems needlessly obscure. */
        lc = dict_last_phone(dict, wid);
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}